

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

numeric_type __thiscall
viennamath::rt_variable<viennamath::rt_expression_interface<double>>::operator()
          (rt_variable<viennamath::rt_expression_interface<double>> *this,
          vector<double,_std::allocator<double>_> *v)

{
  pointer pdVar1;
  undefined8 uVar2;
  pointer pdVar3;
  undefined8 *puVar4;
  
  pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if (*(ulong *)(this + 8) <
      (ulong)((long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar1 >> 3)) {
    return pdVar1[*(ulong *)(this + 8)];
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x18);
  uVar2 = *(undefined8 *)(this + 8);
  pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  pdVar3 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  *puVar4 = &PTR__exception_00133280;
  puVar4[1] = uVar2;
  puVar4[2] = (long)pdVar1 - (long)pdVar3 >> 3;
  __cxa_throw(puVar4,&variable_index_out_of_bounds_exception::typeinfo,std::exception::~exception);
}

Assistant:

numeric_type
      operator()(VectorType const & v) const
      {
        if(id_ >= v.size())
          throw variable_index_out_of_bounds_exception(static_cast<long>(id_), static_cast<long>(v.size()));
        return get_from_vector(v, id_);
      }